

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_item_t_conflict
MIR_new_ref_data(MIR_context_t ctx,char *name,MIR_item_t_conflict ref_item,int64_t disp)

{
  long lVar1;
  MIR_item_t_conflict pMVar2;
  MIR_ref_data_t pMVar3;
  char *pcVar4;
  MIR_item_t_conflict pMVar5;
  MIR_lref_data_t pMVar6;
  MIR_label_t pMVar7;
  MIR_label_t extraout_RDX;
  char *pcVar8;
  MIR_label_t item;
  MIR_context_t ctx_00;
  char *pcVar9;
  MIR_context_t pMVar10;
  int64_t in_R8;
  
  pMVar7 = (MIR_label_t)disp;
  pMVar2 = create_item(ctx,MIR_ref_data_item,"ref data");
  pMVar3 = (MIR_ref_data_t)malloc(0x20);
  (pMVar2->u).ref_data = pMVar3;
  if (pMVar3 != (MIR_ref_data_t)0x0) {
    if (name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = get_ctx_str(ctx,name);
    }
    pMVar3->name = pcVar4;
    pMVar3->ref_item = ref_item;
    pMVar3->disp = disp;
    if (pcVar4 == (char *)0x0) {
      DLIST_MIR_item_t_append(&ctx->curr_module->items,pMVar2);
    }
    else {
      pMVar5 = add_item(ctx,pMVar2);
      if (pMVar5 != pMVar2) {
        free(pMVar2);
        pMVar2 = pMVar5;
      }
    }
    return pMVar2;
  }
  free(pMVar2);
  pcVar9 = "Not enough memory for creation of ref data %s";
  pcVar4 = "";
  if (name != (char *)0x0) {
    pcVar4 = name;
  }
  pMVar10 = (MIR_context_t)0x3;
  (*ctx->error_func)(MIR_alloc_error,"Not enough memory for creation of ref data %s",pcVar4);
  pMVar2 = create_item(pMVar10,MIR_lref_data_item,"lref data");
  if (extraout_RDX == (MIR_label_t)0x0) {
    free(pMVar2);
    pcVar4 = "null label for lref data %s";
  }
  else {
    pMVar6 = (MIR_lref_data_t)malloc(0x40);
    (pMVar2->u).lref_data = pMVar6;
    if (pMVar6 != (MIR_lref_data_t)0x0) {
      if (pcVar9 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = get_ctx_str(pMVar10,pcVar9);
      }
      pMVar6->name = pcVar4;
      pMVar6->label = extraout_RDX;
      pMVar6->label2 = pMVar7;
      pMVar6->disp = in_R8;
      pMVar6->next = (MIR_lref_data *)0x0;
      pMVar6->orig_label = (MIR_label_t)0x0;
      pMVar6->orig_label2 = (MIR_label_t)0x0;
      if (pcVar4 == (char *)0x0) {
        DLIST_MIR_item_t_append(&pMVar10->curr_module->items,pMVar2);
      }
      else {
        pMVar5 = add_item(pMVar10,pMVar2);
        if (pMVar5 != pMVar2) {
          free(pMVar2);
          pMVar2 = pMVar5;
        }
      }
      return pMVar2;
    }
    free(pMVar2);
    pcVar4 = "Not enough memory for creation of lref data %s";
  }
  pcVar8 = "";
  if (pcVar9 != (char *)0x0) {
    pcVar8 = pcVar9;
  }
  ctx_00 = (MIR_context_t)0x3;
  (*pMVar10->error_func)(MIR_alloc_error,pcVar4,pcVar8);
  pMVar2 = create_item(ctx_00,MIR_expr_data_item,"expr data");
  pMVar10 = (MIR_context_t)&DAT_00000018;
  pMVar6 = (MIR_lref_data_t)malloc(0x18);
  (pMVar2->u).lref_data = pMVar6;
  if (pMVar6 != (MIR_lref_data_t)0x0) {
    if (item == (MIR_label_t)0x0) goto LAB_00110bee;
    if ((((*(int *)&item->ops[0].data == 0) &&
         (lVar1 = *(long *)((long)&item->ops[0].u + 0x10), *(char *)(lVar1 + 0x50) == '\0')) &&
        (*(int *)(lVar1 + 0x3c) == 0)) && (*(int *)(lVar1 + 0x38) == 1)) {
      if (pcVar4 == (char *)0x0) {
        pMVar6->name = (char *)0x0;
        pMVar6->label = item;
      }
      else {
        pcVar4 = get_ctx_str(ctx_00,pcVar4);
        pMVar6->name = pcVar4;
        pMVar6->label = item;
        if (pcVar4 != (char *)0x0) {
          pMVar5 = add_item(ctx_00,pMVar2);
          if (pMVar5 == pMVar2) {
            return pMVar2;
          }
          free(pMVar2);
          return pMVar5;
        }
      }
      DLIST_MIR_item_t_append(&ctx_00->curr_module->items,pMVar2);
      return pMVar2;
    }
    ctx_00 = (MIR_context_t)ctx_00->error_func;
    pcVar9 = MIR_item_name(pMVar10,(MIR_item_t_conflict)item);
    (*(code *)ctx_00)(2,"%s can not be an expr which should be non-argument, one result function",
                      pcVar9);
  }
  free(pMVar2);
  pcVar9 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar9 = pcVar4;
  }
  (*ctx_00->error_func)(MIR_alloc_error,"Not enough memory for creation of expr data %s",pcVar9);
LAB_00110bee:
  __assert_fail("expr_item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x4e2,"MIR_item_t MIR_new_expr_data(MIR_context_t, const char *, MIR_item_t)");
}

Assistant:

MIR_item_t MIR_new_ref_data (MIR_context_t ctx, const char *name, MIR_item_t ref_item,
                             int64_t disp) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_ref_data_item, "ref data");
  MIR_ref_data_t ref_data;

  item->u.ref_data = ref_data = malloc (sizeof (struct MIR_ref_data));
  if (ref_data == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of ref data %s",
                              name == NULL ? "" : name);
  }
  if (name != NULL) name = get_ctx_str (ctx, name);
  ref_data->name = name;
  ref_data->ref_item = ref_item;
  ref_data->disp = disp;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}